

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase604::run(TestCase604 *this)

{
  PromiseArena *pPVar1;
  undefined1 auVar2 [8];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> node;
  OwnPromiseNode node_00;
  PromiseBase node_01;
  Iface *pIVar3;
  int iVar4;
  __pid_t _Var5;
  void *pvVar6;
  ssize_t sVar7;
  TransformPromiseNodeBase *pTVar8;
  char c;
  OwnFd clientFd;
  Fault f_7;
  OwnFd serverFd;
  DebugComparison<char,_char_&> _kjCondition;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:670:62),_void>
  failPromise;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:669:58),_void>
  promise;
  socklen_t saddrLen;
  FdObserver failObserver;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:659:3)>
  _kjDefer659;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:629:3)>
  _kjDefer632;
  int failpipe [2];
  WaitScope waitScope;
  FdObserver observer;
  sockaddr_in saddr;
  Thread thread;
  EventLoop loop;
  UnixEventPort port;
  char local_34d;
  OwnFd local_34c;
  Fault local_348;
  OwnFd local_33c;
  undefined1 local_338 [8];
  char *pcStack_330;
  Disposer *local_328;
  PromiseFulfiller<void> *local_320;
  bool local_318;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_310;
  OwnPromiseNode local_308;
  PromiseBase local_300;
  socklen_t local_2f4;
  Function<void_()> local_2f0;
  FdObserver local_2e0;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:659:3)>
  local_288;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:629:3)>
  local_278;
  int local_268 [2];
  EventLoop *local_260;
  undefined4 local_258;
  long local_250;
  undefined8 uStack_248;
  char *local_240;
  char *pcStack_238;
  undefined8 local_230;
  FdObserver local_228;
  sockaddr local_1c8;
  Thread local_1b0;
  EventLoop local_198;
  UnixEventPort local_120;
  
  UnixEventPort::UnixEventPort(&local_120);
  EventLoop::EventLoop(&local_198,&local_120.super_EventPort);
  local_258 = 0xffffffff;
  local_250 = 0;
  uStack_248 = 0;
  local_260 = &local_198;
  EventLoop::enterScope(&local_198);
  do {
    local_33c.fd = socket(2,1,0);
    if (-1 < local_33c.fd) goto LAB_001e4a19;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_2e0.eventPort = (UnixEventPort *)0x0;
    local_228.eventPort = (UnixEventPort *)0x0;
    local_228.fd = 0;
    local_228.flags = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2e0);
  }
LAB_001e4a19:
  local_1c8.sa_data[6] = '\0';
  local_1c8.sa_data[7] = '\0';
  local_1c8.sa_data[8] = '\0';
  local_1c8.sa_data[9] = '\0';
  local_1c8.sa_data[10] = '\0';
  local_1c8.sa_data[0xb] = '\0';
  local_1c8.sa_data[0xc] = '\0';
  local_1c8.sa_data[0xd] = '\0';
  local_1c8.sa_family = 2;
  local_1c8.sa_data[0] = '\0';
  local_1c8.sa_data[1] = '\0';
  local_1c8.sa_data[2] = '\x7f';
  local_1c8.sa_data[3] = '\0';
  local_1c8.sa_data[4] = '\0';
  local_1c8.sa_data[5] = '\x01';
  do {
    iVar4 = bind(local_33c.fd,&local_1c8,0x10);
    if (-1 < iVar4) goto LAB_001e4a60;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_2e0.eventPort = (UnixEventPort *)0x0;
    local_228.eventPort = (UnixEventPort *)0x0;
    local_228.fd = 0;
    local_228.flags = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2e0);
  }
LAB_001e4a60:
  local_2f4 = 0x10;
  do {
    iVar4 = getsockname(local_33c.fd,&local_1c8,&local_2f4);
    if (-1 < iVar4) goto LAB_001e4a9a;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_2e0.eventPort = (UnixEventPort *)0x0;
    local_228.eventPort = (UnixEventPort *)0x0;
    local_228.fd = 0;
    local_228.flags = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2e0);
  }
LAB_001e4a9a:
  do {
    iVar4 = listen(local_33c.fd,1);
    if (-1 < iVar4) goto LAB_001e4ac0;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_2e0.eventPort = (UnixEventPort *)0x0;
    local_228.eventPort = (UnixEventPort *)0x0;
    local_228.fd = 0;
    local_228.flags = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2e0);
  }
LAB_001e4ac0:
  local_268[0] = 0;
  local_268[1] = 0;
  do {
    iVar4 = ::pipe(local_268);
    if (-1 < iVar4) goto LAB_001e4aef;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_2e0.eventPort = (UnixEventPort *)0x0;
    local_228.eventPort = (UnixEventPort *)0x0;
    local_228.fd = 0;
    local_228.flags = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2e0);
  }
LAB_001e4aef:
  local_278.maybeFunc.ptr.isSet = true;
  local_278.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:629:3)>_2
        )local_268;
  local_2f0.impl.ptr = (Iface *)operator_new(0x18);
  (local_2f0.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00609dc0;
  *(OwnFd **)(local_2f0.impl.ptr + 1) = &local_33c;
  *(int **)(local_2f0.impl.ptr + 2) = local_268;
  local_2f0.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase604::run()::$_6>>
        ::instance;
  Thread::Thread(&local_1b0,&local_2f0);
  pIVar3 = local_2f0.impl.ptr;
  if (local_2f0.impl.ptr != (Iface *)0x0) {
    local_2f0.impl.ptr = (Iface *)0x0;
    (**(local_2f0.impl.disposer)->_vptr_Disposer)
              (local_2f0.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
  }
  local_288.maybeFunc.ptr.isSet = true;
  local_288.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:659:3)>_2
        )&local_33c;
  do {
    local_34c.fd = socket(2,1,0);
    if (-1 < local_34c.fd) goto LAB_001e4ba5;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_2e0.eventPort = (UnixEventPort *)0x0;
    local_228.eventPort = (UnixEventPort *)0x0;
    local_228.fd = 0;
    local_228.flags = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2e0);
  }
LAB_001e4ba5:
  do {
    iVar4 = ::connect(local_34c.fd,&local_1c8,local_2f4);
    if (-1 < iVar4) goto LAB_001e4bd9;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_2e0.eventPort = (UnixEventPort *)0x0;
    local_228.eventPort = (UnixEventPort *)0x0;
    local_228.fd = 0;
    local_228.flags = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_2e0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_2e0);
  }
LAB_001e4bd9:
  UnixEventPort::FdObserver::FdObserver(&local_228,&local_120,local_34c.fd,5);
  UnixEventPort::FdObserver::FdObserver(&local_2e0,&local_120,local_268[0],5);
  UnixEventPort::FdObserver::whenUrgentDataAvailable((FdObserver *)local_338);
  auVar2 = local_338;
  pPVar1 = (PromiseArena *)
           ((SleepHooks *)&((PromiseArenaMember *)local_338)->arena)->_vptr_SleepHooks;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_338 - (long)pPVar1) < 0x28) {
    pvVar6 = operator_new(0x400);
    pTVar8 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar8,(OwnPromiseNode *)local_338,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:669:58)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_00609e28;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    ((SleepHooks *)&((PromiseArenaMember *)local_338)->arena)->_vptr_SleepHooks = (_func_int **)0x0;
    pTVar8 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)((long)local_338 + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar8,(OwnPromiseNode *)local_338,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:669:58)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)auVar2 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00609e28;
    ((PromiseArenaMember *)((long)auVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  auVar2 = local_338;
  local_308.ptr = &pTVar8->super_PromiseNode;
  if (local_338 != (undefined1  [8])0x0) {
    local_338 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar2);
  }
  UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_338);
  auVar2 = local_338;
  pPVar1 = (PromiseArena *)
           ((SleepHooks *)&((PromiseArenaMember *)local_338)->arena)->_vptr_SleepHooks;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_338 - (long)pPVar1) < 0x28) {
    pvVar6 = operator_new(0x400);
    pTVar8 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar8,(OwnPromiseNode *)local_338,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:670:62)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_00609e80;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    ((SleepHooks *)&((PromiseArenaMember *)local_338)->arena)->_vptr_SleepHooks = (_func_int **)0x0;
    pTVar8 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)((long)local_338 + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar8,(OwnPromiseNode *)local_338,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:670:62)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)auVar2 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00609e80;
    ((PromiseArenaMember *)((long)auVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  auVar2 = local_338;
  local_310.ptr = &pTVar8->super_PromiseNode;
  if (local_338 != (undefined1  [8])0x0) {
    local_338 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar2);
  }
  local_338 = (undefined1  [8])0x49c70f;
  pcStack_330 = "run";
  local_328 = (Disposer *)0x17000002a0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((PromiseDisposer *)&local_348,&local_308,&local_310,(SourceLocation *)local_338);
  local_300.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_348.exception;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  pcStack_238 = "run";
  local_230 = 0x17000002a0;
  _Var5 = Promise<bool>::wait((Promise<bool> *)&local_300,&local_260);
  node_01.node.ptr = local_300.node.ptr;
  if (local_300.node.ptr != (PromiseNode *)0x0) {
    local_300.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_01.node.ptr);
  }
  if ((char)_Var5 == '\0') {
    if (kj::_::Debug::minSeverity < 2) {
      kj::_::Debug::log<char_const(&)[55]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2b2,WARNING,"\"MSG_OOB doesn\'t seem to be supported on your platform.\"",
                 (char (*) [55])"MSG_OOB doesn\'t seem to be supported on your platform.");
    }
  }
  else {
    do {
      sVar7 = recv(local_34c.fd,&local_34d,1,1);
      if (-1 < sVar7) goto LAB_001e4e71;
      iVar4 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar4 == -1);
    if (iVar4 != 0) {
      local_348.exception = (Exception *)0x0;
      local_338 = (undefined1  [8])0x0;
      pcStack_330 = (char *)0x0;
      kj::_::Debug::Fault::init
                (&local_348,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      kj::_::Debug::Fault::fatal(&local_348);
    }
LAB_001e4e71:
    local_318 = local_34d == 'o';
    local_338[0] = 0x6f;
    local_328 = (Disposer *)0x48a289;
    local_320 = (PromiseFulfiller<void> *)&DAT_00000005;
    pcStack_330 = &local_34d;
    if ((!local_318) && (kj::_::Debug::minSeverity < 3)) {
      local_348.exception._0_1_ = 0x6f;
      kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<char,char&>&,char,char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2ad,ERROR,"\"failed: expected \" \"(\'o\') == (c)\", _kjCondition, \'o\', c",
                 (char (*) [30])"failed: expected (\'o\') == (c)",
                 (DebugComparison<char,_char_&> *)local_338,(char *)&local_348,&local_34d);
    }
    do {
      sVar7 = recv(local_34c.fd,&local_34d,1,0);
      if (-1 < sVar7) goto LAB_001e4f11;
      iVar4 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar4 == -1);
    if (iVar4 != 0) {
      local_348.exception = (Exception *)0x0;
      local_338 = (undefined1  [8])0x0;
      pcStack_330 = (char *)0x0;
      kj::_::Debug::Fault::init
                (&local_348,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      kj::_::Debug::Fault::fatal(&local_348);
    }
LAB_001e4f11:
    local_318 = local_34d == 'i';
    local_338[0] = 0x69;
    local_328 = (Disposer *)0x48a289;
    local_320 = (PromiseFulfiller<void> *)&DAT_00000005;
    pcStack_330 = &local_34d;
    if ((!local_318) && (kj::_::Debug::minSeverity < 3)) {
      local_348.exception._0_1_ = 0x69;
      kj::_::Debug::log<char_const(&)[30],kj::_::DebugComparison<char,char&>&,char,char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x2af,ERROR,"\"failed: expected \" \"(\'i\') == (c)\", _kjCondition, \'i\', c",
                 (char (*) [30])"failed: expected (\'i\') == (c)",
                 (DebugComparison<char,_char_&> *)local_338,(char *)&local_348,&local_34d);
    }
  }
  local_34d = 'q';
  do {
    sVar7 = ::send(local_34c.fd,&local_34d,1,0);
    if (-1 < sVar7) goto LAB_001e4fd8;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_348.exception = (Exception *)0x0;
    local_338 = (undefined1  [8])0x0;
    pcStack_330 = (char *)0x0;
    kj::_::Debug::Fault::init
              (&local_348,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_348);
  }
LAB_001e4fd8:
  do {
    iVar4 = shutdown(local_34c.fd,2);
    if (-1 < iVar4) goto LAB_001e4ffe;
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_348.exception = (Exception *)0x0;
    local_338 = (undefined1  [8])0x0;
    pcStack_330 = (char *)0x0;
    kj::_::Debug::Fault::init
              (&local_348,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_348);
  }
LAB_001e4ffe:
  node.ptr = local_310.ptr;
  if ((TransformPromiseNodeBase *)local_310.ptr != (TransformPromiseNodeBase *)0x0) {
    local_310.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  node_00.ptr = local_308.ptr;
  if ((TransformPromiseNodeBase *)local_308.ptr != (TransformPromiseNodeBase *)0x0) {
    local_308.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node_00.ptr)->super_PromiseArenaMember);
  }
  UnixEventPort::FdObserver::~FdObserver(&local_2e0);
  UnixEventPort::FdObserver::~FdObserver(&local_228);
  OwnFd::~OwnFd(&local_34c);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:659:3)>
  ::~Deferred(&local_288);
  Thread::~Thread(&local_1b0);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:629:3)>
  ::~Deferred(&local_278);
  OwnFd::~OwnFd(&local_33c);
  if (local_250 == 0) {
    EventLoop::leaveScope(local_260);
  }
  EventLoop::~EventLoop(&local_198);
  UnixEventPort::~UnixEventPort(&local_120);
  return;
}

Assistant:

TEST(AsyncUnixTest, UrgentObserver) {
  // Verify that FdObserver correctly detects availability of out-of-band data.
  // Availability of out-of-band data is implementation-specific.
  // Linux's and OS X's TCP/IP stack supports out-of-band messages for TCP sockets, which is used
  // for this test.

  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);
  char c;

  // Spawn a TCP server
  auto serverFd = KJ_SYSCALL_FD(socket(AF_INET, SOCK_STREAM, 0));
  sockaddr_in saddr;
  memset(&saddr, 0, sizeof(saddr));
  saddr.sin_family = AF_INET;
  saddr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
  KJ_SYSCALL(bind(serverFd, reinterpret_cast<sockaddr*>(&saddr), sizeof(saddr)));
  socklen_t saddrLen = sizeof(saddr);
  KJ_SYSCALL(getsockname(serverFd, reinterpret_cast<sockaddr*>(&saddr), &saddrLen));
  KJ_SYSCALL(listen(serverFd, 1));

  // Create a pipe that we'll use to signal if MSG_OOB return EINVAL.
  int failpipe[2]{};
  KJ_SYSCALL(pipe(failpipe));
  KJ_DEFER({
    close(failpipe[0]);
    close(failpipe[1]);
  });

  // Accept one connection, send in-band and OOB byte, wait for a quit message
  Thread thread([&]() {
    char c;

    sockaddr_in caddr;
    socklen_t caddrLen = sizeof(caddr);
    auto clientFd = KJ_SYSCALL_FD(accept(serverFd, reinterpret_cast<sockaddr*>(&caddr), &caddrLen));
    delay();

    // Workaround: OS X won't signal POLLPRI without POLLIN. Also enqueue some in-band data.
    c = 'i';
    KJ_SYSCALL(send(clientFd, &c, 1, 0));
    c = 'o';
    KJ_SYSCALL_HANDLE_ERRORS(send(clientFd, &c, 1, MSG_OOB)) {
      case EINVAL:
        // Looks like MSG_OOB is not supported. (This is the case e.g. on WSL.)
        KJ_SYSCALL(write(failpipe[1], &c, 1));
        break;
      default:
        KJ_FAIL_SYSCALL("send(..., MSG_OOB)", error);
    }

    KJ_SYSCALL(recv(clientFd, &c, 1, 0));
    EXPECT_EQ('q', c);
  });
  KJ_DEFER({ shutdown(serverFd, SHUT_RDWR); serverFd = nullptr; });

  auto clientFd = KJ_SYSCALL_FD(socket(AF_INET, SOCK_STREAM, 0));
  KJ_SYSCALL(connect(clientFd, reinterpret_cast<sockaddr*>(&saddr), saddrLen));

  UnixEventPort::FdObserver observer(port, clientFd,
      UnixEventPort::FdObserver::OBSERVE_READ | UnixEventPort::FdObserver::OBSERVE_URGENT);
  UnixEventPort::FdObserver failObserver(port, failpipe[0],
      UnixEventPort::FdObserver::OBSERVE_READ | UnixEventPort::FdObserver::OBSERVE_URGENT);

  auto promise = observer.whenUrgentDataAvailable().then([]() { return true; });
  auto failPromise = failObserver.whenBecomesReadable().then([]() { return false; });

  bool oobSupported = promise.exclusiveJoin(kj::mv(failPromise)).wait(waitScope);
  if (oobSupported) {
#if __CYGWIN__
    // On Cygwin, reading the urgent byte first causes the subsequent regular read to block until
    // such a time as the connection closes -- and then the byte is successfully returned. This
    // seems to be a cygwin bug.
    KJ_SYSCALL(recv(clientFd, &c, 1, 0));
    EXPECT_EQ('i', c);
    KJ_SYSCALL(recv(clientFd, &c, 1, MSG_OOB));
    EXPECT_EQ('o', c);
#else
    // Attempt to read the urgent byte prior to reading the in-band byte.
    KJ_SYSCALL(recv(clientFd, &c, 1, MSG_OOB));
    EXPECT_EQ('o', c);
    KJ_SYSCALL(recv(clientFd, &c, 1, 0));
    EXPECT_EQ('i', c);
#endif
  } else {
    KJ_LOG(WARNING, "MSG_OOB doesn't seem to be supported on your platform.");
  }

  // Allow server thread to let its clientFd go out of scope.
  c = 'q';
  KJ_SYSCALL(send(clientFd, &c, 1, 0));
  KJ_SYSCALL(shutdown(clientFd, SHUT_RDWR));
}